

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::TestInvokerAsMethod<(anonymous_namespace)::C_A_T_C_H_T_E_S_T_112>::invoke
          (TestInvokerAsMethod<(anonymous_namespace)::C_A_T_C_H_T_E_S_T_112> *this)

{
  code *pcVar1;
  long *plVar2;
  C_A_T_C_H_T_E_S_T_112 obj;
  SubcommandProgram local_3d0;
  
  SubcommandProgram::SubcommandProgram(&local_3d0);
  local_3d0.super_TApp._vptr_TApp = (_func_int **)&PTR__SubcommandProgram_00234ce0;
  pcVar1 = (code *)this->m_testAsMethod;
  plVar2 = (long *)((long)&local_3d0.super_TApp._vptr_TApp + *(long *)&this->field_0x10);
  if (((ulong)pcVar1 & 1) != 0) {
    pcVar1 = *(code **)(pcVar1 + *plVar2 + -1);
  }
  (*pcVar1)(plVar2);
  local_3d0.super_TApp._vptr_TApp = (_func_int **)&PTR__SubcommandProgram_00236eb0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0.file._M_dataplus._M_p != &local_3d0.file.field_2) {
    operator_delete(local_3d0.file._M_dataplus._M_p);
  }
  local_3d0.super_TApp._vptr_TApp = (_func_int **)&PTR__TApp_00236e78;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_3d0.super_TApp.args);
  CLI::App::~App(&local_3d0.super_TApp.app);
  return;
}

Assistant:

void invoke() const override {
        C obj;
        (obj.*m_testAsMethod)();
    }